

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantTriangleSetTestInstance::compare
          (InvariantTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
          PerPrimitiveVec *primitivesB,int param_3)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *log;
  int param_3_local;
  PerPrimitiveVec *primitivesB_local;
  PerPrimitiveVec *primitivesA_local;
  InvariantTriangleSetTestInstance *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_InvarianceTestInstance).super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_00);
  bVar1 = compareTriangleSets(primitivesA,primitivesB,log);
  return bVar1;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog());
	}